

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f-call-cxx.cpp
# Opt level: O0

void __thiscall TwoDArray::TwoDArray(TwoDArray *this,int n0,int n1)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int **ppiVar4;
  int *piVar5;
  int local_1c;
  int i;
  int n1_local;
  int n0_local;
  TwoDArray *this_local;
  
  this->n0_ = n0;
  this->n1_ = n1;
  this->array_ = (int **)0x0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)n0;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppiVar4 = (int **)operator_new__(uVar3);
  this->array_ = ppiVar4;
  for (local_1c = 0; local_1c < n0; local_1c = local_1c + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)n1;
    uVar3 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    piVar5 = (int *)operator_new__(uVar3);
    this->array_[local_1c] = piVar5;
  }
  return;
}

Assistant:

TwoDArray::TwoDArray(int n0, int n1) {
  int i;
  n0_ = n0;
  n1_ = n1;
  array_ = NULL;
  array_ = new int*[n0];
  for (i = 0; i < n0; i++) {
    array_[i] = new int[n1];
  }
}